

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cc
# Opt level: O0

void tvm::runtime::LoadMetaDataFromFile
               (string *file_name,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
               *fmap)

{
  byte bVar1;
  char *pcVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  undefined1 local_438 [8];
  JSONObjectReadHelper helper;
  JSONReader reader;
  string version;
  istream local_220 [8];
  ifstream fs;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tvm::runtime::FunctionInfo>_>_>
  *fmap_local;
  string *file_name_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_in);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) != 0) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)((long)&version.field_2 + 8),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/file_util.cc"
               ,0xa0);
    poVar3 = dmlc::LogMessageFatal::stream_abi_cxx11_
                       ((LogMessageFatal *)((long)&version.field_2 + 8));
    poVar4 = std::operator<<((ostream *)poVar3,"Check failed: !fs.fail()");
    poVar4 = std::operator<<(poVar4,": ");
    poVar4 = std::operator<<(poVar4,"Cannot open file ");
    std::operator<<(poVar4,(string *)file_name);
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)((long)&version.field_2 + 8));
  }
  std::__cxx11::string::string
            ((string *)
             &reader.scope_counter_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  dmlc::JSONReader::JSONReader
            ((JSONReader *)&helper.map_._M_t._M_impl.super__Rb_tree_header._M_node_count,local_220);
  dmlc::JSONObjectReadHelper::JSONObjectReadHelper((JSONObjectReadHelper *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_458,"tvm_version",&local_459);
  dmlc::JSONObjectReadHelper::DeclareField<std::__cxx11::string>
            ((JSONObjectReadHelper *)local_438,&local_458,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &reader.scope_counter_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_458);
  std::allocator<char>::~allocator(&local_459);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"func_info",&local_481);
  dmlc::JSONObjectReadHelper::
  DeclareField<std::unordered_map<std::__cxx11::string,tvm::runtime::FunctionInfo,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tvm::runtime::FunctionInfo>>>>
            ((JSONObjectReadHelper *)local_438,&local_480,fmap);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator(&local_481);
  dmlc::JSONObjectReadHelper::ReadAllFields
            ((JSONObjectReadHelper *)local_438,
             (JSONReader *)&helper.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::ifstream::close();
  dmlc::JSONObjectReadHelper::~JSONObjectReadHelper((JSONObjectReadHelper *)local_438);
  dmlc::JSONReader::~JSONReader
            ((JSONReader *)&helper.map_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string
            ((string *)
             &reader.scope_counter_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void LoadMetaDataFromFile(
    const std::string &file_name,
    std::unordered_map<std::string, FunctionInfo> *fmap) {
  std::ifstream fs(file_name.c_str());
  CHECK(!fs.fail()) << "Cannot open file " << file_name;
  std::string version;
  dmlc::JSONReader reader(&fs);
  dmlc::JSONObjectReadHelper helper;
  helper.DeclareField("tvm_version", &version);
  helper.DeclareField("func_info", fmap);
  helper.ReadAllFields(&reader);
  fs.close();
}